

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

int __thiscall
DeviceTy::associatePtr(DeviceTy *this,void *HstPtrBegin,void *TgtPtrBegin,int64_t Size)

{
  bool bVar1;
  reference pHVar2;
  long in_RCX;
  uintptr_t in_RDX;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *in_RSI;
  mutex *in_RDI;
  HostDataToTargetTy newEntry;
  bool isValid;
  HostDataToTargetTy *HT;
  iterator __end1;
  iterator __begin1;
  HostDataToTargetListTy *__range1;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  _Self local_40;
  _Self local_38;
  undefined1 *local_30;
  long local_28;
  uintptr_t local_20;
  list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::mutex::lock(in_RDI);
  local_30 = (undefined1 *)((long)&(in_RDI->super___mutex_base)._M_mutex + 0x20);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::begin
                 ((list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
                  CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::end
                 ((list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
                  CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      HostDataToTargetTy::HostDataToTargetTy((HostDataToTargetTy *)&stack0xffffffffffffff88);
      std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::push_front
                (local_18,(value_type *)local_18);
      std::mutex::unlock((mutex *)0x103454);
      return 0;
    }
    pHVar2 = std::_List_iterator<HostDataToTargetTy>::operator*
                       ((_List_iterator<HostDataToTargetTy> *)0x10332f);
    if (local_18 ==
        (list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)pHVar2->HstPtrBegin) break;
    std::_List_iterator<HostDataToTargetTy>::operator++(&local_38);
  }
  bVar1 = false;
  if (((list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)pHVar2->HstPtrBegin ==
       local_18) &&
     (bVar1 = false,
     pHVar2->HstPtrEnd ==
     (long)&(local_18->super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>).
            _M_impl._M_node.super__List_node_base._M_next + local_28)) {
    bVar1 = pHVar2->TgtPtrBegin == local_20;
  }
  std::mutex::unlock((mutex *)0x1033b2);
  if (bVar1) {
    return 0;
  }
  return -1;
}

Assistant:

int DeviceTy::associatePtr(void *HstPtrBegin, void *TgtPtrBegin, int64_t Size) {
  DataMapMtx.lock();

  // Check if entry exists
  for (auto &HT : HostDataToTargetMap) {
    if ((uintptr_t)HstPtrBegin == HT.HstPtrBegin) {
      // Mapping already exists
      bool isValid = HT.HstPtrBegin == (uintptr_t) HstPtrBegin &&
                     HT.HstPtrEnd == (uintptr_t) HstPtrBegin + Size &&
                     HT.TgtPtrBegin == (uintptr_t) TgtPtrBegin;
      DataMapMtx.unlock();
      if (isValid) {
        DP("Attempt to re-associate the same device ptr+offset with the same "
            "host ptr, nothing to do\n");
        return OFFLOAD_SUCCESS;
      } else {
        DP("Not allowed to re-associate a different device ptr+offset with the "
            "same host ptr\n");
        return OFFLOAD_FAIL;
      }
    }
  }

  // Mapping does not exist, allocate it
  HostDataToTargetTy newEntry;

  // Set up missing fields
  newEntry.HstPtrBase = (uintptr_t) HstPtrBegin;
  newEntry.HstPtrBegin = (uintptr_t) HstPtrBegin;
  newEntry.HstPtrEnd = (uintptr_t) HstPtrBegin + Size;
  newEntry.TgtPtrBegin = (uintptr_t) TgtPtrBegin;
  // refCount must be infinite
  newEntry.RefCount = INF_REF_CNT;

  DP("Creating new map entry: HstBase=" DPxMOD ", HstBegin=" DPxMOD ", HstEnd="
      DPxMOD ", TgtBegin=" DPxMOD "\n", DPxPTR(newEntry.HstPtrBase),
      DPxPTR(newEntry.HstPtrBegin), DPxPTR(newEntry.HstPtrEnd),
      DPxPTR(newEntry.TgtPtrBegin));
  HostDataToTargetMap.push_front(newEntry);

  DataMapMtx.unlock();

  return OFFLOAD_SUCCESS;
}